

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O2

isoent * isoent_new(isofile *file)

{
  mode_t mVar1;
  isoent *piVar2;
  
  piVar2 = (isoent *)calloc(1,0xf0);
  if (piVar2 != (isoent *)0x0) {
    piVar2->file = file;
    (piVar2->children).last = &(piVar2->children).first;
    __archive_rb_tree_init(&piVar2->rbtree,&isoent_new::rb_ops);
    (piVar2->subdirs).first = (isoent *)0x0;
    (piVar2->subdirs).last = &(piVar2->subdirs).first;
    (piVar2->extr_rec_list).first = (extr_rec *)0x0;
    (piVar2->extr_rec_list).last = &(piVar2->extr_rec_list).first;
    (piVar2->extr_rec_list).current = (extr_rec *)0x0;
    mVar1 = archive_entry_filetype(file->entry);
    if (mVar1 == 0x4000) {
      piVar2->field_0xe8 = piVar2->field_0xe8 | 2;
    }
  }
  return piVar2;
}

Assistant:

static struct isoent *
isoent_new(struct isofile *file)
{
	struct isoent *isoent;
	static const struct archive_rb_tree_ops rb_ops = {
		isoent_cmp_node, isoent_cmp_key,
	};

	isoent = calloc(1, sizeof(*isoent));
	if (isoent == NULL)
		return (NULL);
	isoent->file = file;
	isoent->children.first = NULL;
	isoent->children.last = &(isoent->children.first);
	__archive_rb_tree_init(&(isoent->rbtree), &rb_ops);
	isoent->subdirs.first = NULL;
	isoent->subdirs.last = &(isoent->subdirs.first);
	isoent->extr_rec_list.first = NULL;
	isoent->extr_rec_list.last = &(isoent->extr_rec_list.first);
	isoent->extr_rec_list.current = NULL;
	if (archive_entry_filetype(file->entry) == AE_IFDIR)
		isoent->dir = 1;

	return (isoent);
}